

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O0

int c_strmatch(char *str,char *pattern)

{
  int iVar1;
  char *str_00;
  char *in_RSI;
  char *in_RDI;
  int ok;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  char *local_10;
  int local_4;
  
  if ((in_RDI == (char *)0x0) || (local_10 = in_RDI, in_RSI == (char *)0x0)) {
    local_4 = 0;
  }
  else {
    for (; *in_RSI != '\0'; in_RSI = in_RSI + 1) {
      if (*in_RSI == '*') {
        str_00 = in_RSI + 1;
        if (*str_00 == '\0') {
          return 1;
        }
        while( true ) {
          if (*local_10 == '\0') {
            return 0;
          }
          iVar1 = c_strmatch(str_00,(char *)CONCAT44(in_stack_ffffffffffffffe4,
                                                     in_stack_ffffffffffffffe0));
          if (iVar1 != 0) break;
          local_10 = local_10 + 1;
          in_stack_ffffffffffffffe4 = 0;
        }
        return 1;
      }
      if (*local_10 == '\0') {
        return 0;
      }
      if ((*in_RSI != '?') && (*local_10 != *in_RSI)) {
        return 0;
      }
      local_10 = local_10 + 1;
    }
    if (*local_10 == '\0') {
      local_4 = 1;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int c_strmatch(const char *str, const char *pattern)
{
    int ok;

    if (str == NULL || pattern == NULL) {
        return 0;
    }

    for (;;) {
        /* Check if pattern is done */
        if (*pattern == '\0') {
            /* If string is at the end, we're good */
            if (*str == '\0') {
                return 1;
            }

            return 0;
        }

        if (*pattern == '*') {
            /* Move on */
            pattern++;

            /* If we are at the end, everything is fine */
            if (*pattern == '\0') {
                return 1;
            }

            /* Try to match each position */
            for (; *str != '\0'; str++) {
                ok = c_strmatch(str, pattern);
                if (ok) {
                    return 1;
                }
            }

            /* No match */
            return 0;
        }

        /* If we are at the end, leave */
        if (*str == '\0') {
            return 0;
        }

        /* Check if we have a single wildcard or matching char */
        if (*pattern != '?' && *str != *pattern) {
            return 0;
        }

        /* Move string and pattern */
        str++;
        pattern++;
    }

    return 0;
}